

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

int64_t gnu_sparse_10_atol(archive_read *a,tar *tar,int64_t *remaining,size_t *unconsumed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  archive_read *a_00;
  long *in_RDX;
  tar *tar_00;
  wchar_t digit;
  wchar_t base;
  ssize_t bytes_read;
  char *p;
  int64_t last_digit_limit;
  int64_t limit;
  int64_t l;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar3;
  ssize_t in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffb8;
  archive_read *local_30;
  
  iVar3 = 10;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  a_00 = SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(10),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  tar_00 = SUB168((auVar2 << 0x40 | ZEXT816(0x7fffffffffffffff)) % SEXT816(10),0);
  do {
    in_stack_ffffffffffffffb0 =
         readline(a_00,tar_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                  (size_t *)CONCAT44(iVar3,in_stack_ffffffffffffffa8));
    if (in_stack_ffffffffffffffb0 < 1) {
      return -0x1e;
    }
    *in_RDX = *in_RDX - in_stack_ffffffffffffffb0;
  } while (*(char *)in_stack_ffffffffffffffb8 == '#');
  local_30 = (archive_read *)0x0;
  while( true ) {
    if (in_stack_ffffffffffffffb0 < 1) {
      return -0x14;
    }
    if (*(char *)in_stack_ffffffffffffffb8 == '\n') break;
    if ((*(char *)in_stack_ffffffffffffffb8 < '0') ||
       (iVar3 + 0x30 <= (int)*(char *)in_stack_ffffffffffffffb8)) {
      return -0x14;
    }
    if (((long)a_00 < (long)local_30) ||
       ((local_30 == a_00 && ((long)tar_00 < (long)(*(char *)in_stack_ffffffffffffffb8 + -0x30)))))
    {
      local_30 = (archive_read *)0x7fffffffffffffff;
    }
    else {
      local_30 = (archive_read *)
                 ((long)local_30 * (long)iVar3 + (long)(*(char *)in_stack_ffffffffffffffb8 + -0x30))
      ;
    }
    in_stack_ffffffffffffffb8 = (char **)((long)in_stack_ffffffffffffffb8 + 1);
    in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + -1;
  }
  return (int64_t)local_30;
}

Assistant:

static int64_t
gnu_sparse_10_atol(struct archive_read *a, struct tar *tar,
    int64_t *remaining, size_t *unconsumed)
{
	int64_t l, limit, last_digit_limit;
	const char *p;
	ssize_t bytes_read;
	int base, digit;

	base = 10;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	/*
	 * Skip any lines starting with '#'; GNU tar specs
	 * don't require this, but they should.
	 */
	do {
		bytes_read = readline(a, tar, &p,
			(ssize_t)tar_min(*remaining, 100), unconsumed);
		if (bytes_read <= 0)
			return (ARCHIVE_FATAL);
		*remaining -= bytes_read;
	} while (p[0] == '#');

	l = 0;
	while (bytes_read > 0) {
		if (*p == '\n')
			return (l);
		if (*p < '0' || *p >= '0' + base)
			return (ARCHIVE_WARN);
		digit = *p - '0';
		if (l > limit || (l == limit && digit > last_digit_limit))
			l = INT64_MAX; /* Truncate on overflow. */
		else
			l = (l * base) + digit;
		p++;
		bytes_read--;
	}
	/* TODO: Error message. */
	return (ARCHIVE_WARN);
}